

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O1

void __thiscall camp::EnumValueNotFound::~EnumValueNotFound(EnumValueNotFound *this)

{
  Error::~Error(&this->super_Error);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API EnumValueNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param value Value of the requested metaenum member
     * \param enumName Name of the owner metaenum
     */
    EnumValueNotFound(long value, const std::string& enumName);
}